

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<long_long,_fmt::v6::basic_format_specs<wchar_t>_>::on_oct
          (int_writer<long_long,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  uint uVar1;
  bin_writer<3> f;
  int iVar2;
  unsigned_type in_RDI;
  string_view sVar3;
  undefined8 unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  format_specs in_stack_00000020;
  int num_digits;
  undefined4 in_stack_fffffffffffffff0;
  unsigned_type uVar4;
  
  uVar4 = in_RDI;
  iVar2 = count_digits<3u,unsigned_long>(*(unsigned_long *)(in_RDI + 0x10));
  if (((*(char *)(*(long *)(in_RDI + 8) + 9) < '\0') &&
      (*(int *)(*(long *)(in_RDI + 8) + 4) <= iVar2)) && (*(long *)(in_RDI + 0x10) != 0)) {
    uVar1 = *(uint *)(in_RDI + 0x1c);
    *(uint *)(in_RDI + 0x1c) = uVar1 + 1;
    *(undefined1 *)(in_RDI + 0x18 + (ulong)uVar1) = 0x30;
  }
  sVar3 = get_prefix((int_writer<long_long,_fmt::v6::basic_format_specs<wchar_t>_> *)0x1fe3cd);
  f._8_8_ = unaff_retaddr;
  f.abs_value = uVar4;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<long_long,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
            ((basic_writer<fmt::v6::buffer_range<wchar_t>_> *)
             CONCAT44(iVar2,in_stack_fffffffffffffff0),sVar3.size_._4_4_,
             (string_view)in_stack_00000008,in_stack_00000020,f);
  return;
}

Assistant:

void on_oct() {
      int num_digits = count_digits<3>(abs_value);
      if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
        // Octal prefix '0' is counted as a digit, so only add it if precision
        // is not greater than the number of digits.
        prefix[prefix_size++] = '0';
      }
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<3>{abs_value, num_digits});
    }